

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void nomul(int nval,char *txt)

{
  char *txt_local;
  int nval_local;
  
  if (nval <= multi) {
    u._1052_1_ = u._1052_1_ & 0xef;
    u.usleep = 0;
    multi = nval;
    if ((txt == (char *)0x0) || (*txt == '\0')) {
      memset(multi_txt,0,0x100);
    }
    else {
      strncpy(multi_txt,txt,0x100);
    }
    flags.run = 0;
    flags.mv = '\0';
    iflags.travel1 = '\0';
    flags.travel = '\0';
  }
  return;
}

Assistant:

void nomul(int nval, const char *txt)
{
	if (multi < nval) return;	/* This is a bug fix by ab@unido */
	u.uinvulnerable = FALSE;	/* Kludge to avoid ctrl-C bug -dlc */
	u.usleep = 0;
	multi = nval;
	if (txt && txt[0])
	    strncpy(multi_txt, txt, BUFSZ);
	else
	    memset(multi_txt, 0, BUFSZ);
	flags.travel = iflags.travel1 = flags.mv = flags.run = 0;
}